

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_index_list.cpp
# Opt level: O0

bool __thiscall duckdb::TableIndexList::NameIsUnique(TableIndexList *this,string *name)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  undefined4 extraout_var;
  long in_RDI;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_true>
  *__range1;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff68;
  pointer in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  pointer in_stack_ffffffffffffff90;
  __normal_iterator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>_>
  local_30;
  long local_28;
  byte local_1;
  
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_28 = in_RDI + 0x28;
  local_30._M_current =
       (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
       ::std::
       vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
       ::begin((vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                *)in_stack_ffffffffffffff68);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ::end((vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
         *)in_stack_ffffffffffffff68);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      local_1 = 1;
LAB_00c3f53d:
      ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xc3f547);
      return (bool)(local_1 & 1);
    }
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>_>
    ::operator*(&local_30);
    unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
              ((unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
               in_stack_ffffffffffffff70);
    bVar1 = Index::IsPrimary(in_stack_ffffffffffffff70);
    if (bVar1) {
LAB_00c3f4b2:
      in_stack_ffffffffffffff70 =
           unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                     ((unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
                      in_stack_ffffffffffffff70);
      iVar3 = (*in_stack_ffffffffffffff70->_vptr_Index[4])();
      in_stack_ffffffffffffff68 = (mutex_type *)CONCAT44(extraout_var,iVar3);
      _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffff90,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      if (_Var2) {
        local_1 = 0;
        goto LAB_00c3f53d;
      }
    }
    else {
      in_stack_ffffffffffffff90 =
           unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                     ((unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
                      in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff8f = Index::IsForeign(in_stack_ffffffffffffff70);
      if ((bool)in_stack_ffffffffffffff8f) goto LAB_00c3f4b2;
      unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                ((unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
                 in_stack_ffffffffffffff70);
      bVar1 = Index::IsUnique(in_stack_ffffffffffffff70);
      if (bVar1) goto LAB_00c3f4b2;
    }
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

bool TableIndexList::NameIsUnique(const string &name) {
	lock_guard<mutex> lock(indexes_lock);

	// Only covers PK, FK, and UNIQUE indexes.
	for (const auto &index : indexes) {
		if (index->IsPrimary() || index->IsForeign() || index->IsUnique()) {
			if (index->GetIndexName() == name) {
				return false;
			}
		}
	}
	return true;
}